

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::ActivationLayer::backpropInplace(ActivationLayer *this,Array *errors)

{
  anon_class_8_1_1722cad4 __unary_op;
  element_type *__va;
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *y_end;
  float *z_begin;
  float *z_end;
  Activation *activation;
  element_type *inputs;
  Array *errors_local;
  ActivationLayer *this_local;
  
  __va = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(this->super_ABackpropLayer).shared);
  __unary_op.activation = this->activationFunction;
  pfVar1 = std::begin<float>(__va);
  pfVar2 = std::end<float>(__va);
  pfVar3 = std::begin<float>(&this->activationGrad);
  ::std::
  transform<float*,float*,notch::core::ActivationLayer::backpropInplace(std::valarray<float>const&)::_lambda(float)_1_>
            (pfVar1,pfVar2,pfVar3,__unary_op);
  pfVar1 = std::begin<float>(&this->activationGrad);
  pfVar2 = std::end<float>(&this->activationGrad);
  pfVar3 = std::begin<float>(errors);
  y_end = std::end<float>(errors);
  z_begin = std::begin<float>(&this->propagatedErrors);
  z_end = std::end<float>(&this->propagatedErrors);
  internal::emul<float*,float_const*,float*>(pfVar1,pfVar2,pfVar3,y_end,z_begin,z_end);
  return;
}

Assistant:

virtual void backpropInplace(const Array &errors) {
        auto &inputs = *shared.inputBuffer;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(activationGrad),
            [&](float y) { return activation.derivative(y); });
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        propagatedErrors = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(propagatedErrors), std::end(propagatedErrors));
#endif
    }